

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldActivator.cpp
# Opt level: O0

XPathMatcher * __thiscall
xercesc_4_0::FieldActivator::activateField(FieldActivator *this,IC_Field *field,int initialDepth)

{
  ValueStore *valueStore_00;
  XPathMatcher *matcher_00;
  XPathMatcher *matcher;
  ValueStore *valueStore;
  int initialDepth_local;
  IC_Field *field_local;
  FieldActivator *this_local;
  
  valueStore_00 = ValueStoreCache::getValueStoreFor(this->fValueStoreCache,field,initialDepth);
  matcher_00 = IC_Field::createMatcher(field,this,valueStore_00,this->fMemoryManager);
  setMayMatch(this,field,true);
  XPathMatcherStack::addMatcher(this->fMatcherStack,matcher_00);
  (*matcher_00->_vptr_XPathMatcher[3])();
  return matcher_00;
}

Assistant:

XPathMatcher* FieldActivator::activateField(IC_Field* const field, const int initialDepth) {

    ValueStore* valueStore = fValueStoreCache->getValueStoreFor(field, initialDepth);
    XPathMatcher* matcher = field->createMatcher(this, valueStore, fMemoryManager);

    setMayMatch(field, true);
    fMatcherStack->addMatcher(matcher);
    matcher->startDocumentFragment();

    return matcher;
}